

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  mpt_stream srm;
  
  memset(&srm,0,0x98);
  srm._rd._state.data.msg = -1;
  if (argc < 2) {
    fprintf(_stderr,"%s %s [%s]\n",*argv,"<executable>","<args>");
  }
  else {
    iVar1 = mpt_stream_pipe(&srm,argv[1],argv + 1);
    if (-1 < iVar1) {
      mpt_stream_setmode(&srm,0x30);
      while (iVar1 = mpt_stream_poll(&srm,0x11,0xffffffff), 0 < iVar1) {
        fprintf(_stderr,"%d (%d)\n",srm._rd.data.len,(ulong)(uint)srm._rd.data.max);
      }
      fwrite(srm._rd.data.base,srm._rd.data.len,1,_stdout);
      mpt_stream_close(&srm);
      return 0;
    }
    perror("call");
  }
  return 1;
}

Assistant:

int main(int argc, char * const argv[])
{
	struct mpt_stream srm = MPT_STREAM_INIT;
	int mode;
	
	if (argc < 2) {
		fprintf(stderr, "%s %s [%s]\n", *argv, "<executable>", "<args>");
		return 1;
	}
	if ((mode = mpt_stream_pipe(&srm._info, argv[1], argv+1)) < 0) {
		perror("call");
		return 1;
	}
	mpt_stream_setmode(&srm, MPT_ENUM(StreamBuffer));
	
	while (mpt_stream_poll(&srm, POLLIN | POLLHUP, -1) > 0) {
		fprintf(stderr, "%d (%d)\n", (int) srm._rd.data.len, (int) srm._rd.data.max);
	}
	fwrite(srm._rd.data.base, srm._rd.data.len, 1, stdout);
	mpt_stream_close(&srm);
	return 0;
}